

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpression.cpp
# Opt level: O3

Token * __thiscall
hdc::LiteralExpression::get_token(Token *__return_storage_ptr__,LiteralExpression *this)

{
  pointer pcVar1;
  int iVar2;
  
  __return_storage_ptr__->column = (this->token).column;
  iVar2 = (this->token).line;
  __return_storage_ptr__->kind = (this->token).kind;
  __return_storage_ptr__->line = iVar2;
  (__return_storage_ptr__->lexem)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->lexem).field_2;
  pcVar1 = (this->token).lexem._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->lexem,pcVar1,
             pcVar1 + (this->token).lexem._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

Token LiteralExpression::get_token() {
    return token;
}